

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::clara::TextFlow::Column::iterator::operator*[abi_cxx11_(iterator *this)

{
  string *psVar1;
  string *in_RDI;
  string *in_stack_00000010;
  iterator *in_stack_00000018;
  string local_30 [48];
  
  psVar1 = line_abi_cxx11_((iterator *)0x17fc8a);
  ::std::__cxx11::string::substr((ulong)local_30,(ulong)psVar1);
  addIndentAndSuffix(in_stack_00000018,in_stack_00000010);
  ::std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

auto operator *() const -> std::string {
			assert(m_stringIndex < m_column.m_strings.size());
			assert(m_pos <= m_end);
			return addIndentAndSuffix(line().substr(m_pos, m_len));
		}